

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<256U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator|=
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,
          uintwide_t<256U,_unsigned_short,_void,_false> *other)

{
  ushort *puVar1;
  long lVar2;
  
  if (this != other) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
      puVar1 = (ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar2);
      *puVar1 = *puVar1 | *(ushort *)
                           ((long)(other->values).super_array<unsigned_short,_16UL>.elems + lVar2);
    }
  }
  return this;
}

Assistant:

constexpr auto operator|=(const uintwide_t& other) -> uintwide_t& // LCOV_EXCL_LINE
    {
      if(this != &other) // LCOV_EXCL_LINE
      {
        auto itr_b = other.values.cbegin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        // Perform bitwise OR.
        for(auto itr_a = values.begin(); itr_a != values.end(); ++itr_a, ++itr_b) // NOLINT(altera-id-dependent-backward-branch,llvm-qualified-auto,readability-qualified-auto)
        {
          *itr_a = static_cast<limb_type>(*itr_a | *itr_b);
        }
      }

      return *this; // LCOV_EXCL_LINE
    }